

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AppendModuleDefinitionFlag
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,
          cmLinkLineComputer *linkLineComputer,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  ulong uVar2;
  string *str;
  string local_148 [32];
  string_view local_128;
  string local_118;
  cmAlphaNum local_f8;
  cmAlphaNum local_c8;
  undefined1 local_98 [8];
  string flag;
  allocator<char> local_61;
  string local_60;
  cmValue local_40;
  cmValue defFileFlag;
  ModuleDefinitionInfo *mdi;
  string *config_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  defFileFlag.Value = &cmGeneratorTarget::GetModuleDefinitionInfo(target,config)->DefFile;
  if (((ModuleDefinitionInfo *)defFileFlag.Value != (ModuleDefinitionInfo *)0x0) &&
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"CMAKE_LINK_DEF_FILE_FLAG",&local_61);
    local_40 = cmMakefile::GetDefinition(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    bVar1 = cmValue::operator_cast_to_bool(&local_40);
    if (bVar1) {
      str = cmValue::operator*[abi_cxx11_(&local_40);
      cmAlphaNum::cmAlphaNum(&local_c8,str);
      (*linkLineComputer->_vptr_cmLinkLineComputer[2])(local_148,linkLineComputer,defFileFlag.Value)
      ;
      local_128 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_148);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_118,&this->super_cmOutputConverter,local_128,SHELL);
      cmAlphaNum::cmAlphaNum(&local_f8,&local_118);
      cmStrCat<>((string *)local_98,&local_c8,&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string(local_148);
      (*this->_vptr_cmLocalGenerator[6])(this,flags,local_98);
      std::__cxx11::string::~string((string *)local_98);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendModuleDefinitionFlag(
  std::string& flags, cmGeneratorTarget const* target,
  cmLinkLineComputer* linkLineComputer, std::string const& config)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    target->GetModuleDefinitionInfo(config);
  if (!mdi || mdi->DefFile.empty()) {
    return;
  }

  cmValue defFileFlag =
    this->Makefile->GetDefinition("CMAKE_LINK_DEF_FILE_FLAG");
  if (!defFileFlag) {
    return;
  }

  // Append the flag and value.  Use ConvertToLinkReference to help
  // vs6's "cl -link" pass it to the linker.
  std::string flag =
    cmStrCat(*defFileFlag,
             this->ConvertToOutputFormat(
               linkLineComputer->ConvertToLinkReference(mdi->DefFile),
               cmOutputConverter::SHELL));
  this->AppendFlags(flags, flag);
}